

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_fragment.cpp
# Opt level: O2

error_code __thiscall
pstore::exchange::import_ns::address_patch::operator()
          (address_patch *this,transaction_base *transaction)

{
  uint uVar1;
  uint uVar2;
  uint64_t uVar3;
  database *pdVar4;
  element_type *peVar5;
  bool bVar6;
  linked_definitions *plVar7;
  value_reference_type ppVar8;
  long lVar9;
  error_code eVar10;
  uint local_35c;
  error_category *local_358;
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  compilations;
  shared_ptr<pstore::repo::fragment> fragment;
  iterator_base<false> local_300;
  shared_ptr<const_pstore::repo::compilation> compilation;
  unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
  uStack_128;
  const_iterator pos;
  
  index::
  get_index<(pstore::trailer::indices)0,pstore::database,pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>
            ((index *)&compilations,(this->db_).ptr_,true);
  repo::fragment::
  load_impl<std::shared_ptr<pstore::repo::fragment>,pstore::repo::fragment::load(pstore::transaction_base&,pstore::extent<pstore::repo::fragment>const&)::_lambda(pstore::extent<pstore::repo::fragment>const&)_1_>
            ((fragment *)&fragment,&this->fragment_extent_,(anon_class_8_1_9131bd3e)transaction);
  plVar7 = repo::fragment::
           at_impl<(pstore::repo::section_kind)18,pstore::repo::fragment&,pstore::repo::linked_definitions>
                     (fragment.
                      super___shared_ptr<pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  uVar3 = plVar7->size_;
  lVar9 = 0;
  while( true ) {
    if (uVar3 << 5 == lVar9) {
      local_35c = 0;
      local_358 = (error_category *)std::_V2::system_category();
      goto LAB_0011fe05;
    }
    index::
    hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
    ::find<pstore::uint128,void>
              (&pos,(hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
                     *)compilations.
                       super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(this->db_).ptr_,
               (uint128 *)((long)&plVar7->definitions_[0].compilation.v_ + lVar9));
    peVar5 = compilations.
             super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    pdVar4 = (this->db_).ptr_;
    memset(&local_300.visited_parents_,0,0xd8);
    local_300.index_ = peVar5;
    local_300.pos_._M_t.
    super___uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
    .
    super__Head_base<0UL,_std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
            )0x0;
    local_300.db_ = pdVar4;
    index::
    hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>
    ::iterator_base<true>::iterator_base<true,void>((iterator_base<true> *)&compilation,&local_300);
    bVar6 = index::
            hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
            ::iterator_base<true>::operator==(&pos,(iterator_base<true> *)&compilation);
    std::
    unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
    ::~unique_ptr(&uStack_128);
    std::
    unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
    ::~unique_ptr(&local_300.pos_);
    if (bVar6) break;
    pdVar4 = transaction->db_;
    ppVar8 = index::
             hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
             ::iterator_base<true>::operator*(&pos);
    repo::compilation::load((compilation *)&compilation,pdVar4,&ppVar8->second);
    uVar1 = *(uint *)((long)&plVar7->definitions_[0].index + lVar9);
    uVar2 = (compilation.
             super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->size_;
    if (uVar1 < uVar2) {
      ppVar8 = index::
               hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>
               ::iterator_base<true>::operator*(&pos);
      *(value_type *)((long)&plVar7->definitions_[0].pointer.a_.a_ + lVar9) =
           (ppVar8->second).addr.a_.a_ +
           (ulong)*(uint *)((long)&plVar7->definitions_[0].index + lVar9) * 0x30 + 0x20;
    }
    else {
      eVar10 = make_error_code(index_out_of_range);
      local_358 = eVar10._M_cat;
      local_35c = eVar10._M_value;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&compilation.
                super___shared_ptr<const_pstore::repo::compilation,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::
    unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
    ::~unique_ptr(&pos.pos_);
    lVar9 = lVar9 + 0x20;
    if (uVar2 <= uVar1) {
LAB_0011fe05:
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&fragment.super___shared_ptr<pstore::repo::fragment,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&compilations.
                  super___shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount);
      eVar10._4_4_ = 0;
      eVar10._M_value = local_35c;
      eVar10._M_cat = local_358;
      return eVar10;
    }
  }
  eVar10 = make_error_code(no_such_compilation);
  local_358 = eVar10._M_cat;
  local_35c = eVar10._M_value;
  std::
  unique_ptr<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>,_std::default_delete<std::pair<const_pstore::uint128,_pstore::extent<pstore::repo::compilation>_>_>_>
  ::~unique_ptr(&pos.pos_);
  goto LAB_0011fe05;
}

Assistant:

std::error_code address_patch::operator() (transaction_base * const transaction) {
                auto const compilations = index::get_index<trailer::indices::compilation> (*db_);

                auto const fragment = repo::fragment::load (*transaction, fragment_extent_);
                for (repo::linked_definitions::value_type & l :
                     fragment->template at<repo::section_kind::linked_definitions> ()) {
                    auto const pos = compilations->find (*db_, l.compilation);
                    if (pos == compilations->end (*db_)) {
                        return error::no_such_compilation;
                    }
                    auto const compilation =
                        repo::compilation::load (transaction->db (), pos->second);
                    static_assert (std::is_unsigned<decltype (l.index)>::value,
                                   "index is not unsigned so we'll have to check for negative");
                    if (l.index >= compilation->size ()) {
                        return error::index_out_of_range;
                    }

                    l.pointer = repo::compilation::index_address (pos->second.addr, l.index);
                }
                return {};
            }